

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
* __thiscall
(anonymous_namespace)::getScopedLinkLibrariesFromTarget_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,cmTarget *Target,
          cmGlobalGenerator *globalGenerator)

{
  _Rb_tree_header *__x;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  cmTarget *pcVar5;
  long lVar6;
  mapped_type *pmVar7;
  iterator iVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  ulong uVar9;
  string interfaceLinkLibraries;
  string linkLibraries;
  string element;
  
  __x = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &__x->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &__x->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceLinkLibraries,"INTERFACE_LINK_LIBRARIES",
             (allocator<char> *)&linkLibraries);
  pcVar2 = cmTarget::GetProperty((cmTarget *)this,&interfaceLinkLibraries);
  std::__cxx11::string::~string((string *)&interfaceLinkLibraries);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceLinkLibraries,"LINK_LIBRARIES",(allocator<char> *)&linkLibraries);
  pcVar3 = cmTarget::GetProperty((cmTarget *)this,&interfaceLinkLibraries);
  std::__cxx11::string::~string((string *)&interfaceLinkLibraries);
  if (pcVar2 != (char *)0x0 || pcVar3 != (char *)0x0) {
    if (pcVar2 == (char *)0x0) {
      pcVar2 = "";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&interfaceLinkLibraries,pcVar2,(allocator<char> *)&linkLibraries);
    pcVar2 = "";
    if (pcVar3 != (char *)0x0) {
      pcVar2 = pcVar3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&linkLibraries,pcVar2,(allocator<char> *)&element);
    uVar9 = 0;
    while (uVar9 < interfaceLinkLibraries._M_string_length) {
      sVar4 = std::__cxx11::string::find((char)&interfaceLinkLibraries,0x3b);
      if (sVar4 == 0xffffffffffffffff) {
        sVar4 = interfaceLinkLibraries._M_string_length;
      }
      std::__cxx11::string::substr((ulong)&element,(ulong)&interfaceLinkLibraries);
      bVar1 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,&element);
      if (bVar1) {
        pcVar5 = cmGlobalGenerator::FindTarget((cmGlobalGenerator *)Target,&element,false);
        if (pcVar5 != (cmTarget *)0x0) {
          std::__cxx11::string::_M_assign((string *)&element);
        }
      }
      lVar6 = std::__cxx11::string::find((char *)&element,0x3dd78b);
      if (lVar6 == -1) {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,&element);
        *pmVar7 = LLT_SCOPE_INTERFACE;
      }
      std::__cxx11::string::~string((string *)&element);
      uVar9 = sVar4 + 1;
    }
    uVar9 = 0;
    while (uVar9 < linkLibraries._M_string_length) {
      sVar4 = std::__cxx11::string::find((char)&linkLibraries,0x3b);
      if (sVar4 == 0xffffffffffffffff) {
        sVar4 = linkLibraries._M_string_length;
      }
      __k = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar4 - uVar9);
      std::__cxx11::string::substr((ulong)&element,(ulong)&linkLibraries);
      bVar1 = cmGlobalGenerator::IsAlias((cmGlobalGenerator *)Target,&element);
      if (bVar1) {
        pcVar5 = cmGlobalGenerator::FindTarget((cmGlobalGenerator *)Target,&element,false);
        if (pcVar5 != (cmTarget *)0x0) {
          std::__cxx11::string::_M_assign((string *)&element);
        }
      }
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
              ::_M_lower_bound((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                                *)(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header.
                                  _M_header._M_parent,(_Link_type)__x,(_Base_ptr)&element,__k);
      if ((_Rb_tree_header *)iVar8._M_node == __x) {
LAB_002527ca:
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&element);
        *pmVar7 = LLT_SCOPE_PRIVATE;
      }
      else {
        bVar1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &element,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)(iVar8._M_node + 1));
        if (bVar1) goto LAB_002527ca;
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                 ::operator[](__return_storage_ptr__,(key_type *)&element);
        if (*pmVar7 == LLT_SCOPE_INTERFACE) {
          pmVar7 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LinkLibraryScopeType>_>_>
                   ::operator[](__return_storage_ptr__,(key_type *)&element);
          *pmVar7 = LLT_SCOPE_PUBLIC;
        }
      }
      std::__cxx11::string::~string((string *)&element);
      uVar9 = sVar4 + 1;
    }
    std::__cxx11::string::~string((string *)&linkLibraries);
    std::__cxx11::string::~string((string *)&interfaceLinkLibraries);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, LinkLibraryScopeType> getScopedLinkLibrariesFromTarget(
  cmTarget* Target, const cmGlobalGenerator* globalGenerator)
{
  char sep = ';';
  std::map<std::string, LinkLibraryScopeType> tokens;
  size_t start = 0, end = 0;

  const char* pInterfaceLinkLibraries =
    Target->GetProperty("INTERFACE_LINK_LIBRARIES");
  const char* pLinkLibraries = Target->GetProperty("LINK_LIBRARIES");

  if (!pInterfaceLinkLibraries && !pLinkLibraries) {
    return tokens; // target is not linked against any other libraries
  }

  // make sure we don't touch a null-ptr
  auto interfaceLinkLibraries =
    std::string(pInterfaceLinkLibraries ? pInterfaceLinkLibraries : "");
  auto linkLibraries = std::string(pLinkLibraries ? pLinkLibraries : "");

  // first extract interfaceLinkLibraries
  while (start < interfaceLinkLibraries.length()) {

    if ((end = interfaceLinkLibraries.find(sep, start)) == std::string::npos) {
      end = interfaceLinkLibraries.length();
    }

    std::string element = interfaceLinkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (std::string::npos == element.find("$<LINK_ONLY:", 0)) {
      // we assume first, that this library is an interface library.
      // if we find it again in the linklibraries property, we promote it to an
      // public library.
      tokens[element] = LLT_SCOPE_INTERFACE;
    } else {
      // this is an private linked static library.
      // we take care of this case in the second iterator.
    }
    start = end + 1;
  }

  // second extract linkLibraries
  start = 0;
  while (start < linkLibraries.length()) {

    if ((end = linkLibraries.find(sep, start)) == std::string::npos) {
      end = linkLibraries.length();
    }

    std::string element = linkLibraries.substr(start, end - start);
    if (globalGenerator->IsAlias(element)) {
      const auto tgt = globalGenerator->FindTarget(element);
      if (tgt) {
        element = tgt->GetName();
      }
    }

    if (tokens.find(element) == tokens.end()) {
      // this library is not found in interfaceLinkLibraries but in
      // linkLibraries.
      // this results in a private linked library.
      tokens[element] = LLT_SCOPE_PRIVATE;
    } else if (LLT_SCOPE_INTERFACE == tokens[element]) {
      // this library is found in interfaceLinkLibraries and linkLibraries.
      // this results in a public linked library.
      tokens[element] = LLT_SCOPE_PUBLIC;
    } else {
      // private and public linked libraries should not be changed anymore.
    }

    start = end + 1;
  }

  return tokens;
}